

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

bool __thiscall pbrt::KdTreeAggregate::IntersectP(KdTreeAggregate *this,Ray *ray,Float raytMax)

{
  Vector3f d;
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  float *pfVar4;
  KdTreeNode *pKVar5;
  Tuple3<pbrt::Point3,_float> *in_RSI;
  long in_RDI;
  long *in_FS_OFFSET;
  float fVar6;
  Float FVar7;
  int belowFirst;
  KdTreeNode *secondChild;
  KdTreeNode *firstChild;
  Float tSplit;
  int axis;
  Primitive *prim;
  int primitiveIndex;
  int i;
  Primitive *p;
  int nPrimitives;
  KdTreeNode *node;
  int nodesVisited;
  int toVisitIndex;
  KdNodeToVisit toVisit [64];
  int maxTodo;
  Vector3f invDir;
  Float tMax;
  Float tMin;
  undefined8 in_stack_fffffffffffffb08;
  long lVar8;
  Vector3<float> *in_stack_fffffffffffffb10;
  float in_stack_fffffffffffffb18;
  uint in_stack_fffffffffffffb1c;
  Float in_stack_fffffffffffffb20;
  float in_stack_fffffffffffffb24;
  char local_4d1;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  Float *in_stack_fffffffffffffb40;
  KdTreeNode *pKVar9;
  undefined8 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb50;
  float fVar10;
  undefined4 in_stack_fffffffffffffb54;
  int local_49c;
  undefined4 in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  float in_stack_fffffffffffffb74;
  KdTreeNode *local_488;
  int local_480;
  int local_47c;
  Point3f in_stack_fffffffffffffb88;
  float afStack_46c [255];
  undefined4 local_70;
  Tuple3<pbrt::Vector3,_float> local_6c;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  undefined8 local_30;
  float local_28;
  float local_24;
  float local_20;
  Tuple3<pbrt::Point3,_float> *local_18;
  
  local_48 = in_RSI->z;
  local_50._0_4_ = in_RSI->x;
  local_50._4_4_ = in_RSI->y;
  local_58 = in_RSI[1].z;
  local_60._0_4_ = in_RSI[1].x;
  local_60._4_4_ = in_RSI[1].y;
  d.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffb70;
  d.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffb6c;
  d.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffb74;
  local_40 = local_60;
  local_38 = local_58;
  local_30 = local_50;
  local_28 = local_48;
  local_18 = in_RSI;
  bVar1 = Bounds3<float>::IntersectP
                    ((Bounds3<float> *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50)
                     ,in_stack_fffffffffffffb88,d,(Float)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                     in_stack_fffffffffffffb40,
                     (Float *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  if (bVar1) {
    Vector3<float>::Vector3
              (in_stack_fffffffffffffb10,(float)((ulong)in_stack_fffffffffffffb08 >> 0x20),
               (float)in_stack_fffffffffffffb08,0.0);
    local_70 = 0x40;
    local_47c = 0;
    local_480 = 0;
    local_488 = *(KdTreeNode **)(in_RDI + 0x40);
    while (local_488 != (KdTreeNode *)0x0) {
      local_480 = local_480 + 1;
      bVar1 = KdTreeNode::IsLeaf(local_488);
      if (bVar1) {
        iVar2 = KdTreeNode::nPrimitives(local_488);
        if (iVar2 == 1) {
          std::vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>::operator[]
                    ((vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *)(in_RDI + 0x10),
                     (long)(local_488->field_0).onePrimitiveIndex);
          bVar1 = Primitive::IntersectP
                            ((Primitive *)
                             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                             (Ray *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                             (Float)((ulong)in_stack_fffffffffffffb10 >> 0x20));
          if (bVar1) {
            *(long *)(*in_FS_OFFSET + -0x358) = (long)local_480 + *(long *)(*in_FS_OFFSET + -0x358);
            return true;
          }
        }
        else {
          for (local_49c = 0; local_49c < iVar2; local_49c = local_49c + 1) {
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),
                                (long)((local_488->field_0).onePrimitiveIndex + local_49c));
            std::vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_>::operator[]
                      ((vector<pbrt::Primitive,_std::allocator<pbrt::Primitive>_> *)(in_RDI + 0x10),
                       (long)*pvVar3);
            bVar1 = Primitive::IntersectP
                              ((Primitive *)
                               CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                               (Ray *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
                               (Float)((ulong)in_stack_fffffffffffffb10 >> 0x20));
            if (bVar1) {
              *(long *)(*in_FS_OFFSET + -0x358) =
                   (long)local_480 + *(long *)(*in_FS_OFFSET + -0x358);
              return true;
            }
          }
        }
        if (local_47c < 1) break;
        local_47c = local_47c + -1;
        local_20 = afStack_46c[(long)local_47c * 4 + -1];
        local_488 = *(KdTreeNode **)(afStack_46c + (long)local_47c * 4 + -3);
        local_24 = afStack_46c[(long)local_47c * 4];
      }
      else {
        iVar2 = KdTreeNode::SplitAxis(local_488);
        in_stack_fffffffffffffb20 = KdTreeNode::SplitPos(local_488);
        in_stack_fffffffffffffb24 = Tuple3<pbrt::Point3,_float>::operator[](local_18,iVar2);
        in_stack_fffffffffffffb24 = in_stack_fffffffffffffb20 - in_stack_fffffffffffffb24;
        pfVar4 = Tuple3<pbrt::Vector3,_float>::operator[](&local_6c,iVar2);
        fVar10 = in_stack_fffffffffffffb24 * *pfVar4;
        fVar6 = Tuple3<pbrt::Point3,_float>::operator[](local_18,iVar2);
        FVar7 = KdTreeNode::SplitPos(local_488);
        local_4d1 = '\x01';
        if (FVar7 <= fVar6) {
          in_stack_fffffffffffffb18 = Tuple3<pbrt::Point3,_float>::operator[](local_18,iVar2);
          FVar7 = KdTreeNode::SplitPos(local_488);
          in_stack_fffffffffffffb1c = in_stack_fffffffffffffb1c & 0xffffff;
          if ((in_stack_fffffffffffffb18 == FVar7) &&
             (!NAN(in_stack_fffffffffffffb18) && !NAN(FVar7))) {
            fVar6 = Tuple3<pbrt::Vector3,_float>::operator[]
                              ((Tuple3<pbrt::Vector3,_float> *)(local_18 + 1),iVar2);
            in_stack_fffffffffffffb1c = CONCAT13(fVar6 <= 0.0,(int3)in_stack_fffffffffffffb1c);
          }
          local_4d1 = (char)(in_stack_fffffffffffffb1c >> 0x18);
        }
        if (local_4d1 == '\0') {
          lVar8 = *(long *)(in_RDI + 0x40);
          iVar2 = KdTreeNode::AboveChild(local_488);
          pKVar5 = (KdTreeNode *)(lVar8 + (long)iVar2 * 8);
          pKVar9 = local_488 + 1;
        }
        else {
          pKVar5 = local_488 + 1;
          in_stack_fffffffffffffb10 = *(Vector3<float> **)(in_RDI + 0x40);
          iVar2 = KdTreeNode::AboveChild(local_488);
          pKVar9 = (KdTreeNode *)
                   (&(in_stack_fffffffffffffb10->super_Tuple3<pbrt::Vector3,_float>).x +
                   (long)iVar2 * 2);
        }
        local_488 = pKVar5;
        if (((fVar10 <= local_24) && (0.0 < fVar10)) && (local_488 = pKVar9, local_20 <= fVar10)) {
          *(KdTreeNode **)(afStack_46c + (long)local_47c * 4 + -3) = pKVar9;
          afStack_46c[(long)local_47c * 4 + -1] = fVar10;
          afStack_46c[(long)local_47c * 4] = local_24;
          local_47c = local_47c + 1;
          local_488 = pKVar5;
          local_24 = fVar10;
        }
      }
    }
    *(long *)(*in_FS_OFFSET + -0x358) = (long)local_480 + *(long *)(*in_FS_OFFSET + -0x358);
  }
  return false;
}

Assistant:

bool KdTreeAggregate::IntersectP(const Ray &ray, Float raytMax) const {
    // Compute initial parametric range of ray inside kd-tree extent
    Float tMin, tMax;
    if (!bounds.IntersectP(ray.o, ray.d, raytMax, &tMin, &tMax))
        return false;

    // Prepare to traverse kd-tree for ray
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    constexpr int maxTodo = 64;
    KdNodeToVisit toVisit[maxTodo];
    int toVisitIndex = 0;
    int nodesVisited = 0;
    const KdTreeNode *node = &nodes[0];
    while (node) {
        ++nodesVisited;
        if (node->IsLeaf()) {
            // Check for shadow ray intersections inside leaf node
            int nPrimitives = node->nPrimitives();
            if (nPrimitives == 1) {
                const Primitive &p = primitives[node->onePrimitiveIndex];
                if (p.IntersectP(ray, raytMax)) {
                    kdNodesVisited += nodesVisited;
                    return true;
                }
            } else {
                for (int i = 0; i < nPrimitives; ++i) {
                    int primitiveIndex =
                        primitiveIndices[node->primitiveIndicesOffset + i];
                    const Primitive &prim = primitives[primitiveIndex];
                    if (prim.IntersectP(ray, raytMax)) {
                        kdNodesVisited += nodesVisited;
                        return true;
                    }
                }
            }

            // Grab next node to process from todo list
            if (toVisitIndex > 0) {
                --toVisitIndex;
                node = toVisit[toVisitIndex].node;
                tMin = toVisit[toVisitIndex].tMin;
                tMax = toVisit[toVisitIndex].tMax;
            } else
                break;
        } else {
            // Process kd-tree interior node

            // Compute parametric distance along ray to split plane
            int axis = node->SplitAxis();
            Float tSplit = (node->SplitPos() - ray.o[axis]) * invDir[axis];

            // Get node children pointers for ray
            const KdTreeNode *firstChild, *secondChild;
            int belowFirst = (ray.o[axis] < node->SplitPos()) ||
                             (ray.o[axis] == node->SplitPos() && ray.d[axis] <= 0);
            if (belowFirst != 0) {
                firstChild = node + 1;
                secondChild = &nodes[node->AboveChild()];
            } else {
                firstChild = &nodes[node->AboveChild()];
                secondChild = node + 1;
            }

            // Advance to next child node, possibly enqueue other child
            if (tSplit > tMax || tSplit <= 0)
                node = firstChild;
            else if (tSplit < tMin)
                node = secondChild;
            else {
                // Enqueue _secondChild_ in todo list
                toVisit[toVisitIndex].node = secondChild;
                toVisit[toVisitIndex].tMin = tSplit;
                toVisit[toVisitIndex].tMax = tMax;
                ++toVisitIndex;
                node = firstChild;
                tMax = tSplit;
            }
        }
    }
    kdNodesVisited += nodesVisited;
    return false;
}